

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void InterruptRPC(void)

{
  long lVar1;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 *in_stack_00000010;
  once_flag *in_stack_00000018;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::call_once<InterruptRPC()::__0>(in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InterruptRPC()
{
    static std::once_flag g_rpc_interrupt_flag;
    // This function could be called twice if the GUI has been started with -server=1.
    std::call_once(g_rpc_interrupt_flag, []() {
        LogDebug(BCLog::RPC, "Interrupting RPC\n");
        // Interrupt e.g. running longpolls
        g_rpc_running = false;
    });
}